

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedmemory.cpp
# Opt level: O0

void __thiscall QSharedMemory::setNativeKey(QSharedMemory *this,QNativeIpcKey *key)

{
  bool bVar1;
  Type TVar2;
  Type TVar3;
  QSharedMemoryPrivate *s;
  QChar fillChar;
  QNativeIpcKey *in_RSI;
  long in_FS_OFFSET;
  QLatin1StringView QVar4;
  QSharedMemoryPrivate *d;
  undefined4 in_stack_ffffffffffffff58;
  Type in_stack_ffffffffffffff5c;
  undefined2 in_stack_ffffffffffffff5e;
  undefined6 in_stack_ffffffffffffff60;
  undefined2 in_stack_ffffffffffffff66;
  QNativeIpcKey *in_stack_ffffffffffffff68;
  int fieldWidth;
  QLatin1String *a;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 uVar5;
  QSharedMemory *in_stack_ffffffffffffffb0;
  QLatin1String local_38 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  s = d_func((QSharedMemory *)0x25fd65);
  bVar1 = ::operator==((QNativeIpcKey *)
                       CONCAT26(in_stack_ffffffffffffff66,in_stack_ffffffffffffff60),
                       (QNativeIpcKey *)
                       CONCAT26(in_stack_ffffffffffffff5e,
                                CONCAT24(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)));
  if ((!bVar1) || (bVar1 = QNativeIpcKey::isEmpty((QNativeIpcKey *)0x25fd90), !bVar1)) {
    QNativeIpcKey::type(in_RSI);
    bVar1 = isKeyTypeSupported(in_stack_ffffffffffffff5c);
    if (bVar1) {
      bVar1 = isAttached((QSharedMemory *)
                         CONCAT26(in_stack_ffffffffffffff66,in_stack_ffffffffffffff60));
      if (bVar1) {
        detach(in_stack_ffffffffffffffb0);
      }
      QSharedMemoryPrivate::cleanHandle
                ((QSharedMemoryPrivate *)
                 CONCAT26(in_stack_ffffffffffffff66,in_stack_ffffffffffffff60));
      TVar2 = QNativeIpcKey::type(in_RSI);
      TVar3 = QNativeIpcKey::type(&s->nativeKey);
      if (TVar2 == TVar3) {
        QNativeIpcKey::operator=
                  (in_stack_ffffffffffffff68,
                   (QNativeIpcKey *)CONCAT26(TVar2,in_stack_ffffffffffffff60));
      }
      else {
        QSharedMemoryPrivate::destructBackend((QSharedMemoryPrivate *)0x25ff19);
        QNativeIpcKey::operator=
                  (in_stack_ffffffffffffff68,
                   (QNativeIpcKey *)CONCAT26(TVar2,in_stack_ffffffffffffff60));
        QSharedMemoryPrivate::constructBackend((QSharedMemoryPrivate *)0x25ff39);
      }
    }
    else {
      uVar5 = 0;
      a = local_38;
      tr((char *)s,(char *)CONCAT26(in_stack_ffffffffffffff66,in_stack_ffffffffffffff60),
         CONCAT22(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff5c));
      QVar4 = Qt::Literals::StringLiterals::operator____L1
                        ((char *)s,CONCAT26(in_stack_ffffffffffffff66,in_stack_ffffffffffffff60));
      fillChar.ucs = QVar4.m_size._6_2_;
      fieldWidth = (int)((ulong)s >> 0x20);
      QChar::QChar<char16_t,_true>((QChar *)&stack0xffffffffffffffb6,L' ');
      QString::arg<QLatin1String,_true>
                ((QString *)CONCAT44(uVar5,in_stack_ffffffffffffff78),a,fieldWidth,fillChar);
      QSharedMemoryPrivate::setError
                ((QSharedMemoryPrivate *)
                 CONCAT26(in_stack_ffffffffffffff66,in_stack_ffffffffffffff60),
                 CONCAT22(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff5c),(QString *)0x25fe46);
      QString::~QString((QString *)0x25fe55);
      QString::~QString((QString *)0x25fe5f);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSharedMemory::setNativeKey(const QNativeIpcKey &key)
{
    Q_D(QSharedMemory);
    if (key == d->nativeKey && key.isEmpty())
        return;
    if (!isKeyTypeSupported(key.type())) {
        d->setError(KeyError, tr("%1: unsupported key type")
                    .arg("QSharedMemory::setNativeKey"_L1));
        return;
    }

    if (isAttached())
        detach();
    d->cleanHandle();
    if (key.type() == d->nativeKey.type()) {
        // we can reuse the backend
        d->nativeKey = key;
    } else {
        // we must recreate the backend
        d->destructBackend();
        d->nativeKey = key;
        d->constructBackend();
    }
}